

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int av1_find_best_obmc_sub_pixel_tree_up
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  MV_COST_PARAMS *mv_cost_params;
  SUBPEL_SEARCH_VAR_PARAMS *var_params;
  SubpelMvLimits *mv_limits;
  SUBPEL_SEARCH_TYPE SVar1;
  int iVar2;
  buf_2d *pbVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  short sVar10;
  uint uVar11;
  short sVar12;
  short sVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  int dummy;
  MV top_mv;
  MV right_mv;
  MV left_mv;
  uint local_90;
  uint local_8c;
  MV diag_mv;
  MV bottom_mv;
  
  iVar2 = ms_params->iters_per_step;
  iVar14 = 3 - (uint)ms_params->forced_stop;
  iVar15 = 3 - (uint)(ms_params->allow_hp == 0);
  mv_cost_params = &ms_params->mv_cost_params;
  if (iVar14 < iVar15) {
    iVar15 = iVar14;
  }
  var_params = &ms_params->var_params;
  SVar1 = (ms_params->var_params).subpel_search_type;
  *bestmv = start_mv;
  if (SVar1 == '\0') {
    pbVar3 = (ms_params->var_params).ms_buffers.ref;
    uVar4 = (*((ms_params->var_params).vfp)->ovf)
                      (pbVar3->buf,pbVar3->stride,(ms_params->var_params).ms_buffers.wsrc,
                       (ms_params->var_params).ms_buffers.obmc_mask,sse1);
  }
  else {
    uVar4 = upsampled_obmc_pref_error(xd,cm,bestmv,var_params,sse1);
  }
  *distortion = uVar4;
  iVar14 = mv_err_cost_(bestmv,mv_cost_params);
  local_90 = iVar14 + uVar4;
  mv_limits = &ms_params->mv_limits;
  iVar14 = 0;
  if (0 < iVar15) {
    iVar14 = iVar15;
  }
  uVar4 = 4;
  do {
    bVar16 = iVar14 == 0;
    iVar14 = iVar14 + -1;
    if (bVar16) {
      return local_90;
    }
    sVar10 = bestmv->row;
    bottom_mv.col = bestmv->col;
    local_8c = (uint)(ushort)bottom_mv.col;
    dummy = 0;
    sVar12 = (short)uVar4;
    left_mv.col = bottom_mv.col - sVar12;
    right_mv.col = bottom_mv.col + sVar12;
    top_mv.col = bottom_mv.col;
    top_mv.row = sVar10 - sVar12;
    bottom_mv.row = sVar10 + sVar12;
    uVar5 = -uVar4;
    right_mv.row = sVar10;
    left_mv.row = sVar10;
    if ((ms_params->var_params).subpel_search_type == '\0') {
      uVar6 = obmc_check_better_fast
                        (&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_90,sse1,
                         distortion,&dummy);
      uVar7 = obmc_check_better_fast
                        (&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_90,sse1,
                         distortion,&dummy);
      uVar8 = obmc_check_better_fast
                        (&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_90,sse1,
                         distortion,&dummy);
      uVar9 = obmc_check_better_fast
                        (&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_90,sse1,
                         distortion,&dummy);
      uVar11 = uVar4;
      if (uVar8 <= uVar9) {
        uVar11 = uVar5;
      }
      uVar8 = uVar4;
      if (uVar6 <= uVar7) {
        uVar8 = uVar5;
      }
      uVar5 = uVar11 & 0xffff | uVar8 << 0x10;
      diag_mv.row = (short)uVar11 + sVar10;
      diag_mv.col = (short)uVar8 + (short)local_8c;
      obmc_check_better_fast
                (&diag_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_90,sse1,distortion,
                 &dummy);
    }
    else {
      uVar6 = obmc_check_better(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_90,
                                sse1,distortion,&dummy);
      uVar7 = obmc_check_better(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_90
                                ,sse1,distortion,&dummy);
      uVar8 = obmc_check_better(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_90,
                                sse1,distortion,&dummy);
      uVar9 = obmc_check_better(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,
                                &local_90,sse1,distortion,&dummy);
      uVar11 = uVar4;
      if (uVar8 <= uVar9) {
        uVar11 = uVar5;
      }
      uVar8 = uVar4;
      if (uVar6 <= uVar7) {
        uVar8 = uVar5;
      }
      uVar5 = uVar11 & 0xffff | uVar8 << 0x10;
      diag_mv.row = (short)uVar11 + sVar10;
      diag_mv.col = (short)uVar8 + (short)local_8c;
      obmc_check_better(xd,cm,&diag_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_90,sse1,
                        distortion,&dummy);
    }
    left_mv.row = bestmv->row;
    sVar12 = (short)(uVar5 >> 0x10);
    if (sVar10 == left_mv.row) {
      if (((short)local_8c != bestmv->col && 1 < iVar2) &&
         (sVar10 = bestmv->col, (short)local_8c != sVar10)) {
        uVar5 = -uVar5;
        sVar13 = sVar12;
LAB_001bd9e1:
        right_mv.row = (short)uVar5 + left_mv.row;
        dummy = CONCAT22(sVar10,right_mv.row);
        right_mv.col = sVar10 + sVar13;
        top_mv.row = 0;
        top_mv.col = 0;
        left_mv.col = right_mv.col;
        if ((ms_params->var_params).subpel_search_type == '\0') {
          obmc_check_better_fast
                    ((MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_90,sse1,
                     distortion,(int *)&top_mv);
          obmc_check_better_fast
                    (&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_90,sse1,distortion,
                     (int *)&top_mv);
          if (top_mv != (MV)0x0) {
            obmc_check_better_fast
                      (&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_90,sse1,
                       distortion,(int *)&top_mv);
          }
        }
        else {
          obmc_check_better(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,&local_90,
                            sse1,distortion,(int *)&top_mv);
          obmc_check_better(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_90,sse1
                            ,distortion,(int *)&top_mv);
          if (top_mv != (MV)0x0) {
            obmc_check_better(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_90,
                              sse1,distortion,(int *)&top_mv);
          }
        }
      }
    }
    else if (1 < iVar2) {
      sVar10 = bestmv->col;
      sVar13 = -sVar12;
      if ((short)local_8c != sVar10) {
        sVar13 = sVar12;
      }
      goto LAB_001bd9e1;
    }
    uVar4 = uVar4 >> 1;
  } while( true );
}

Assistant:

int av1_find_best_obmc_sub_pixel_tree_up(
    MACROBLOCKD *xd, const AV1_COMMON *const cm,
    const SUBPEL_MOTION_SEARCH_PARAMS *ms_params, MV start_mv,
    const FULLPEL_MV_STATS *start_mv_stats, MV *bestmv, int *distortion,
    unsigned int *sse1, int_mv *last_mv_search_list) {
  (void)last_mv_search_list;
  (void)start_mv_stats;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;
  const SUBPEL_SEARCH_TYPE subpel_search_type =
      ms_params->var_params.subpel_search_type;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;

  int hstep = INIT_SUBPEL_STEP_SIZE;
  const int round = AOMMIN(FULL_PEL - forced_stop, 3 - !allow_hp);

  unsigned int besterr = INT_MAX;
  *bestmv = start_mv;

  if (subpel_search_type != USE_2_TAPS_ORIG)
    besterr = upsampled_setup_obmc_center_error(
        xd, cm, bestmv, var_params, mv_cost_params, sse1, distortion);
  else
    besterr = setup_obmc_center_error(bestmv, var_params, mv_cost_params, sse1,
                                      distortion);

  for (int iter = 0; iter < round; ++iter) {
    MV iter_center_mv = *bestmv;
    MV diag_step = obmc_first_level_check(xd, cm, iter_center_mv, bestmv, hstep,
                                          mv_limits, var_params, mv_cost_params,
                                          &besterr, sse1, distortion);

    if (!CHECK_MV_EQUAL(iter_center_mv, *bestmv) && iters_per_step > 1) {
      obmc_second_level_check_v2(xd, cm, iter_center_mv, diag_step, bestmv,
                                 mv_limits, var_params, mv_cost_params,
                                 &besterr, sse1, distortion);
    }
    hstep >>= 1;
  }

  return besterr;
}